

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

bool CoreML::Specification::operator==(NeuralNetworkImageScaler *a,NeuralNetworkImageScaler *b)

{
  if (((((a->redbias_ == b->redbias_) && (!NAN(a->redbias_) && !NAN(b->redbias_))) &&
       (a->bluebias_ == b->bluebias_)) &&
      ((!NAN(a->bluebias_) && !NAN(b->bluebias_) && (a->greenbias_ == b->greenbias_)))) &&
     (!NAN(a->greenbias_) && !NAN(b->greenbias_))) {
    if ((a->graybias_ == b->graybias_) && (!NAN(a->graybias_) && !NAN(b->graybias_))) {
      return (bool)(-(b->channelscale_ == a->channelscale_) & 1);
    }
  }
  return false;
}

Assistant:

inline float NeuralNetworkImageScaler::redbias() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.NeuralNetworkImageScaler.redBias)
  return redbias_;
}